

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,SQChar *sourcename,
                   SQBool raiseerror)

{
  SQSharedState *ss;
  SQObjectValue func;
  bool bVar1;
  SQWeakRef *root;
  SQClosure *x;
  SQRESULT SVar2;
  SQObjectPtr o;
  SQObjectPtr local_28;
  
  o.super_SQObject._type = OT_NULL;
  o.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar1 = Compile(v,read,p,sourcename,&o,raiseerror != 0,v->_sharedstate->_debuginfo);
  func = o.super_SQObject._unVal;
  if (bVar1) {
    ss = v->_sharedstate;
    root = SQRefCounted::GetWeakRef((v->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
    x = SQClosure::Create(ss,func.pFunctionProto,root);
    SQObjectPtr::SQObjectPtr(&local_28,x);
    SQVM::Push(v,&local_28);
    SQObjectPtr::~SQObjectPtr(&local_28);
    SVar2 = 0;
  }
  else {
    SVar2 = -1;
  }
  SQObjectPtr::~SQObjectPtr(&o);
  return SVar2;
}

Assistant:

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,const SQChar *sourcename,SQBool raiseerror)
{
    SQObjectPtr o;
#ifndef NO_COMPILER
    if(Compile(v, read, p, sourcename, o, raiseerror?true:false, _ss(v)->_debuginfo)) {
        v->Push(SQClosure::Create(_ss(v), _funcproto(o), _table(v->_roottable)->GetWeakRef(OT_TABLE)));
        return SQ_OK;
    }
    return SQ_ERROR;
#else
    return sq_throwerror(v,_SC("this is a no compiler build"));
#endif
}